

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_7d7e51::cmLBDepend::GenerateDependInformation
          (cmLBDepend *this,cmDependInformation *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  cmMakefile *this_00;
  size_t __n;
  pointer pcVar3;
  char *__n_00;
  cmLBDepend *pcVar4;
  cmDependInformation *pcVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  cmSourceFile *pcVar11;
  string *psVar12;
  undefined8 uVar13;
  char cVar14;
  _Alloc_hider _Var15;
  const_iterator __begin4;
  pointer pbVar16;
  string *path;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  basic_string_view<char,_std::char_traits<char>_> __str;
  size_type __dnew;
  string cxxFile;
  string root;
  string includeFile;
  string line;
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_310;
  size_type local_308;
  pointer local_300;
  cmLBDepend *local_2f8;
  string local_2f0;
  string local_2d0;
  string *local_2b0;
  cmDependInformation *local_2a8;
  long *local_2a0;
  long local_298;
  long local_290 [2];
  string local_280;
  string local_260;
  RegularExpression *local_240;
  string local_238;
  byte abStack_218 [488];
  
  if (info->DependDone != false) {
    return;
  }
  info->DependDone = true;
  if ((info->FullPath)._M_string_length == 0) {
    local_338._M_dataplus._M_p = (pointer)0x33;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    local_238._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_238,(ulong)&local_338);
    local_238.field_2._M_allocated_capacity = (size_type)local_338._M_dataplus._M_p;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x20) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x21) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x22) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x23) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x24) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x25) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x26) = 'w';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x27) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x28) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x29) = 'h';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2a) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2b) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2c) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2d) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2e) = 'p';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2f) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x10) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x11) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x12) = 'p';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x13) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x14) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x15) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x16) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x17) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x18) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x19) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x1a) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x1b) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x1c) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x1d) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x1e) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x1f) = 'r';
    *(undefined8 *)local_238._M_dataplus._M_p = 0x2074706d65747441;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 8) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 9) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 10) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0xb) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0xc) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0xd) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0xe) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0xf) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2f) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x30) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x31) = 'h';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x32) = '!';
    local_238._M_string_length = (size_type)local_338._M_dataplus._M_p;
    local_238._M_dataplus._M_p[(long)local_338._M_dataplus._M_p] = '\0';
    cmSystemTools::Error(&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p == &local_238.field_2) {
      return;
    }
    goto LAB_002307b4;
  }
  psVar12 = &info->FullPath;
  bVar6 = cmsys::SystemTools::FileExists(psVar12,true);
  local_2f8 = this;
  local_2b0 = psVar12;
  local_2a8 = info;
  if (bVar6) {
    std::ifstream::ifstream(&local_238,(psVar12->_M_dataplus)._M_p,_S_in);
    if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      local_260._M_string_length = 0;
      local_260.field_2._M_local_buf[0] = '\0';
      local_240 = &this->IncludeFileRegularExpression;
LAB_0022fe18:
      do {
        bVar6 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&local_238,&local_260,(bool *)0x0,0xffffffffffffffff);
        if (!bVar6) goto LAB_00230549;
        local_338._M_dataplus._M_p = (pointer)local_260._M_string_length;
        local_338._M_string_length = (size_type)local_260._M_dataplus._M_p;
        __str._M_str = "#include";
        __str._M_len = 8;
        iVar9 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_338,0,8,__str)
        ;
        if (iVar9 == 0) {
          cVar14 = (char)&local_260;
          lVar10 = std::__cxx11::string::find(cVar14,0x22);
          if (lVar10 == -1) {
            lVar10 = std::__cxx11::string::find(cVar14,0x3c);
            if (lVar10 != -1) {
              bVar7 = 0x3e;
              goto LAB_0022feb7;
            }
            std::operator+(&local_338,"unknown include directive ",&local_260);
            cmSystemTools::Error(&local_338);
            uVar13 = local_338.field_2._M_allocated_capacity;
            _Var15._M_p = local_338._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338._M_dataplus._M_p == &local_338.field_2) goto LAB_0022fe18;
          }
          else {
            bVar7 = 0x22;
LAB_0022feb7:
            std::__cxx11::string::find(cVar14,(ulong)bVar7);
            std::__cxx11::string::substr((ulong)&local_280,(ulong)&local_260);
            bVar6 = cmsys::RegularExpression::find
                              (local_240,local_280._M_dataplus._M_p,&local_240->regmatch);
            info = local_2a8;
            if (bVar6) {
              AddDependency(this,local_2a8,&local_280);
              local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2f0,local_280._M_dataplus._M_p,
                         local_280._M_dataplus._M_p + local_280._M_string_length);
              lVar10 = std::__cxx11::string::rfind((char)&local_2f0,0x2e);
              if (lVar10 != -1) {
                std::__cxx11::string::substr((ulong)&local_2a0,(ulong)&local_2f0);
                local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_338,local_2a0,local_298 + (long)local_2a0);
                std::__cxx11::string::append((char *)&local_338);
                std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_338);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_338._M_dataplus._M_p != &local_338.field_2) {
                  operator_delete(local_338._M_dataplus._M_p,
                                  local_338.field_2._M_allocated_capacity + 1);
                }
                bVar6 = cmsys::SystemTools::FileExists(&local_2f0);
                pbVar2 = (this->IncludeDirectories).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar16 = (this->IncludeDirectories).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar2;
                    pbVar16 = pbVar16 + 1) {
                  local_338._M_string_length = (size_type)(pbVar16->_M_dataplus)._M_p;
                  local_338._M_dataplus._M_p = (pointer)pbVar16->_M_string_length;
                  local_338.field_2._M_allocated_capacity = 1;
                  local_338.field_2._8_8_ =
                       (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
                  local_318 = local_2f0._M_string_length;
                  local_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2f0._M_dataplus._M_p;
                  views._M_len = 3;
                  views._M_array = (iterator)&local_338;
                  cmCatViews_abi_cxx11_(&local_2d0,views);
                  bVar8 = cmsys::SystemTools::FileExists(&local_2d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar8) {
                    bVar6 = true;
                  }
                }
                if (bVar6 == false) {
                  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_338,local_2a0,local_298 + (long)local_2a0);
                  std::__cxx11::string::append((char *)&local_338);
                  pcVar4 = local_2f8;
                  std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_338);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_338._M_dataplus._M_p != &local_338.field_2) {
                    operator_delete(local_338._M_dataplus._M_p,
                                    local_338.field_2._M_allocated_capacity + 1);
                  }
                  bVar8 = cmsys::SystemTools::FileExists(&local_2f0);
                  if (bVar8) {
                    bVar6 = true;
                  }
                  pbVar2 = (pcVar4->IncludeDirectories).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pbVar16 = (pcVar4->IncludeDirectories).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar2;
                      pbVar16 = pbVar16 + 1) {
                    local_338._M_string_length = (size_type)(pbVar16->_M_dataplus)._M_p;
                    local_338._M_dataplus._M_p = (pointer)pbVar16->_M_string_length;
                    local_338.field_2._M_allocated_capacity = 1;
                    local_338.field_2._8_8_ =
                         (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
                    local_318 = local_2f0._M_string_length;
                    local_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2f0._M_dataplus._M_p;
                    views_01._M_len = 3;
                    views_01._M_array = (iterator)&local_338;
                    cmCatViews_abi_cxx11_(&local_2d0,views_01);
                    bVar8 = cmsys::SystemTools::FileExists(&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if (bVar8) {
                      bVar6 = true;
                    }
                  }
                }
                if (bVar6 == false) {
                  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_338,local_2a0,local_298 + (long)local_2a0);
                  std::__cxx11::string::append((char *)&local_338);
                  pcVar4 = local_2f8;
                  std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_338);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_338._M_dataplus._M_p != &local_338.field_2) {
                    operator_delete(local_338._M_dataplus._M_p,
                                    local_338.field_2._M_allocated_capacity + 1);
                  }
                  bVar8 = cmsys::SystemTools::FileExists(&local_2f0);
                  if (bVar8) {
                    bVar6 = true;
                  }
                  pbVar2 = (pcVar4->IncludeDirectories).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pbVar16 = (pcVar4->IncludeDirectories).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar2;
                      pbVar16 = pbVar16 + 1) {
                    local_338._M_string_length = (size_type)(pbVar16->_M_dataplus)._M_p;
                    local_338._M_dataplus._M_p = (pointer)pbVar16->_M_string_length;
                    local_338.field_2._M_allocated_capacity = 1;
                    local_338.field_2._8_8_ =
                         (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
                    local_318 = local_2f0._M_string_length;
                    local_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2f0._M_dataplus._M_p;
                    views_02._M_len = 3;
                    views_02._M_array = (iterator)&local_338;
                    cmCatViews_abi_cxx11_(&local_2d0,views_02);
                    bVar8 = cmsys::SystemTools::FileExists(&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if (bVar8) {
                      bVar6 = true;
                    }
                  }
                }
                if (bVar6 == false) {
                  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_338,local_2a0,local_298 + (long)local_2a0);
                  std::__cxx11::string::append((char *)&local_338);
                  pcVar4 = local_2f8;
                  std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_338);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_338._M_dataplus._M_p != &local_338.field_2) {
                    operator_delete(local_338._M_dataplus._M_p,
                                    local_338.field_2._M_allocated_capacity + 1);
                  }
                  bVar8 = cmsys::SystemTools::FileExists(&local_2f0);
                  if (bVar8) {
                    bVar6 = true;
                  }
                  pbVar2 = (pcVar4->IncludeDirectories).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pbVar16 = (pcVar4->IncludeDirectories).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar2;
                      pbVar16 = pbVar16 + 1) {
                    local_338._M_string_length = (size_type)(pbVar16->_M_dataplus)._M_p;
                    local_338._M_dataplus._M_p = (pointer)pbVar16->_M_string_length;
                    local_338.field_2._M_allocated_capacity = 1;
                    local_338.field_2._8_8_ =
                         (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
                    local_318 = local_2f0._M_string_length;
                    local_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2f0._M_dataplus._M_p;
                    views_03._M_len = 3;
                    views_03._M_array = (iterator)&local_338;
                    cmCatViews_abi_cxx11_(&local_2d0,views_03);
                    bVar8 = cmsys::SystemTools::FileExists(&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if (bVar8) {
                      bVar6 = true;
                    }
                  }
                }
                info = local_2a8;
                this = local_2f8;
                if (bVar6 != false) {
                  AddDependency(local_2f8,local_2a8,&local_2f0);
                }
                if (local_2a0 != local_290) {
                  operator_delete(local_2a0,local_290[0] + 1);
                }
              }
LAB_00230171:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
              }
            }
            else if (this->Verbose == true) {
              local_338._M_dataplus._M_p = (pointer)0x9;
              local_338._M_string_length = 0x69c4c1;
              local_338.field_2._M_allocated_capacity = local_280._M_string_length;
              local_338.field_2._8_8_ = local_280._M_dataplus._M_p;
              local_318 = 10;
              local_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x69c4cb;
              local_300 = (local_2a8->FullPath)._M_dataplus._M_p;
              local_308 = (local_2a8->FullPath)._M_string_length;
              views_00._M_len = 4;
              views_00._M_array = (iterator)&local_338;
              cmCatViews_abi_cxx11_(&local_2f0,views_00);
              cmSystemTools::Error(&local_2f0);
              goto LAB_00230171;
            }
            uVar13 = local_280.field_2._M_allocated_capacity;
            _Var15._M_p = local_280._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p == &local_280.field_2) goto LAB_0022fe18;
          }
          operator_delete(_Var15._M_p,uVar13 + 1);
        }
      } while( true );
    }
    std::operator+(&local_338,"error can not open ",psVar12);
    cmSystemTools::Error(&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0023056e;
  }
  bVar6 = false;
LAB_0023057e:
  pcVar4 = local_2f8;
  pcVar11 = info->SourceFile;
  if (pcVar11 != (cmSourceFile *)0x0) {
    pbVar16 = (pcVar11->Depends).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pcVar11->Depends).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar16 != pbVar2) {
      do {
        AddDependency(pcVar4,info,pbVar16);
        pbVar16 = pbVar16 + 1;
      } while (pbVar16 != pbVar2);
      bVar6 = true;
    }
  }
  bVar8 = bVar6;
  if (!bVar6) {
    this_00 = local_2f8->Makefile;
    cmsys::SystemTools::GetFilenameWithoutExtension(&local_238,psVar12);
    pcVar11 = cmMakefile::GetSource(this_00,&local_238,Ambiguous);
    paVar1 = &local_238.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar1) {
      operator_delete(local_238._M_dataplus._M_p,
                      (ulong)(local_238.field_2._M_allocated_capacity + 1));
    }
    if (pcVar11 != (cmSourceFile *)0x0) {
      psVar12 = cmSourceFile::ResolveFullPath(pcVar11,(string *)0x0,(string *)0x0);
      __n = psVar12->_M_string_length;
      if ((__n != (info->FullPath)._M_string_length) ||
         ((bVar8 = true, __n != 0 &&
          (iVar9 = bcmp((psVar12->_M_dataplus)._M_p,(local_2b0->_M_dataplus)._M_p,__n), iVar9 != 0))
         )) {
        pbVar16 = (local_2f8->IncludeDirectories).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 = (local_2f8->IncludeDirectories).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar8 = bVar6;
        if (pbVar16 != pbVar2) {
          do {
            pcVar3 = (pbVar16->_M_dataplus)._M_p;
            local_238._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_238,pcVar3,pcVar3 + pbVar16->_M_string_length);
            if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_238._M_string_length !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0) && ((local_238._M_dataplus._M_p + -1)[local_238._M_string_length] != '/'))
            {
              std::__cxx11::string::append((char *)&local_238);
            }
            std::__cxx11::string::_M_append
                      ((char *)&local_238,(ulong)(local_2a8->FullPath)._M_dataplus._M_p);
            psVar12 = cmSourceFile::ResolveFullPath(pcVar11,(string *)0x0,(string *)0x0);
            __n_00 = (char *)psVar12->_M_string_length;
            if ((__n_00 == (char *)local_238._M_string_length) &&
               ((__n_00 == (char *)0x0 ||
                (iVar9 = bcmp((psVar12->_M_dataplus)._M_p,local_238._M_dataplus._M_p,(size_t)__n_00)
                , iVar9 == 0)))) {
              bVar8 = true;
              std::__cxx11::string::_M_assign((string *)local_2b0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != paVar1) {
              operator_delete(local_238._M_dataplus._M_p,
                              (ulong)(local_238.field_2._M_allocated_capacity + 1));
            }
            pbVar16 = pbVar16 + 1;
          } while (pbVar16 != pbVar2);
        }
      }
    }
  }
  pcVar5 = local_2a8;
  if (bVar8) {
    return;
  }
  bVar6 = cmsys::RegularExpression::find
                    (&local_2f8->ComplainFileRegularExpression,
                     (local_2a8->IncludeName)._M_dataplus._M_p,
                     &(local_2f8->ComplainFileRegularExpression).regmatch);
  if (!bVar6) {
    (pcVar5->FullPath)._M_string_length = 0;
    *(pcVar5->FullPath)._M_dataplus._M_p = '\0';
    return;
  }
  std::operator+(&local_238,"error cannot find dependencies for ",local_2b0);
  cmSystemTools::Error(&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p == &local_238.field_2) {
    return;
  }
LAB_002307b4:
  operator_delete(local_238._M_dataplus._M_p,(ulong)(local_238.field_2._M_allocated_capacity + 1));
  return;
LAB_00230549:
  psVar12 = local_2b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
    psVar12 = local_2b0;
  }
LAB_0023056e:
  std::ifstream::~ifstream(&local_238);
  bVar6 = true;
  goto LAB_0023057e;
}

Assistant:

void GenerateDependInformation(cmDependInformation* info)
  {
    // If dependencies are already done, stop now.
    if (info->DependDone) {
      return;
    }
    // Make sure we don't visit the same file more than once.
    info->DependDone = true;

    const std::string& path = info->FullPath;
    if (path.empty()) {
      cmSystemTools::Error(
        "Attempt to find dependencies for file without path!");
      return;
    }

    bool found = false;

    // If the file exists, use it to find dependency information.
    if (cmSystemTools::FileExists(path, true)) {
      // Use the real file to find its dependencies.
      this->DependWalk(info);
      found = true;
    }

    // See if the cmSourceFile for it has any files specified as
    // dependency hints.
    if (info->SourceFile != nullptr) {

      // Get the cmSourceFile corresponding to this.
      const cmSourceFile& cFile = *(info->SourceFile);
      // See if there are any hints for finding dependencies for the missing
      // file.
      if (!cFile.GetDepends().empty()) {
        // Dependency hints have been given.  Use them to begin the
        // recursion.
        for (std::string const& file : cFile.GetDepends()) {
          this->AddDependency(info, file);
        }

        // Found dependency information.  We are done.
        found = true;
      }
    }

    if (!found) {
      // Try to find the file amongst the sources
      cmSourceFile* srcFile = this->Makefile->GetSource(
        cmSystemTools::GetFilenameWithoutExtension(path));
      if (srcFile) {
        if (srcFile->ResolveFullPath() == path) {
          found = true;
        } else {
          // try to guess which include path to use
          for (std::string incpath : this->IncludeDirectories) {
            if (!incpath.empty() && incpath.back() != '/') {
              incpath += "/";
            }
            incpath += path;
            if (srcFile->ResolveFullPath() == incpath) {
              // set the path to the guessed path
              info->FullPath = incpath;
              found = true;
            }
          }
        }
      }
    }

    if (!found) {
      // Couldn't find any dependency information.
      if (this->ComplainFileRegularExpression.find(info->IncludeName)) {
        cmSystemTools::Error("error cannot find dependencies for " + path);
      } else {
        // Destroy the name of the file so that it won't be output as a
        // dependency.
        info->FullPath.clear();
      }
    }
  }